

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O3

void __thiscall
HighsSimplexAnalysis::reportRunTime(HighsSimplexAnalysis *this,bool header,double run_time)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined7 in_register_00000031;
  string local_30;
  
  if ((int)CONCAT71(in_register_00000031,header) == 0) {
    pbVar1 = (this->analysis_log)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    highsFormatToString_abi_cxx11_(&local_30," %ds",(ulong)(uint)(int)(run_time + 0.49));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(pbVar1 + 0x10),local_30._M_dataplus._M_p,local_30._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportRunTime(const bool header,
                                         const double run_time) {
  if (header) return;
#ifndef NDEBUG
  *analysis_log << highsFormatToString(" %15.8gs", run_time);
#else
  *analysis_log << highsFormatToString(" %ds", int(run_time + 0.49));
#endif
}